

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O2

void __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::ClassArray(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             *this,int p_size,int p_max,double p_fac)

{
  undefined8 *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  int n;
  long lVar3;
  int iVar4;
  int i;
  long lVar5;
  
  this->_vptr_ClassArray = (_func_int **)&PTR__ClassArray_00546710;
  this->data = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  this->memFactor = p_fac;
  lVar5 = 0;
  iVar4 = p_size;
  if (p_size < 1) {
    iVar4 = 0;
  }
  this->thesize = iVar4;
  n = 1;
  if (0 < p_size) {
    n = iVar4;
  }
  if (iVar4 < p_max) {
    n = p_max;
  }
  this->themax = n;
  spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
            (&this->data,n);
  lVar3 = 0x80;
  for (; lVar5 < this->themax; lVar5 = lVar5 + 1) {
    pNVar2 = this->data;
    *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + -8) = 0x1c00000000;
    puVar1 = (undefined8 *)((long)(&pNVar2->val + -1) + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(&(pNVar2->val).m_backend.data + -1) + lVar3);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + -0x60);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + -0x50);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + -0x13) = 0;
    puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3) = 0;
    lVar3 = lVar3 + 0x84;
  }
  return;
}

Assistant:

explicit ClassArray(int p_size = 0, int p_max = 0, double p_fac = 1.2)
      : data(nullptr)
      , memFactor(p_fac)
   {
      thesize = (p_size < 0) ? 0 : p_size;

      if(p_max > thesize)
         themax = p_max;
      else
         themax = (thesize == 0) ? 1 : thesize;

      spx_alloc(data, max());

      /* call default constructor for each element */
      for(int i = 0; i < max(); i++)
         new(&(data[i])) T();

      assert(isConsistent());
   }